

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenModuleRef
BinaryenModuleReadWithFeatures(char *input,size_t inputSize,BinaryenFeatures features)

{
  Module *this;
  bool *input_00;
  void *__buf;
  Module *pMVar1;
  unsigned_long __n2;
  undefined1 local_438 [8];
  WasmBinaryReader parser;
  
  this = (Module *)operator_new(0x3f0);
  wasm::Module::Module(this);
  parser.hasDataCount = false;
  parser._1001_7_ = 0;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&parser.hasDataCount,inputSize);
  if (inputSize != 0) {
    memmove((void *)parser._1000_8_,input,inputSize);
  }
  input_00 = &parser.hasDataCount;
  pMVar1 = this;
  wasm::WasmBinaryReader::WasmBinaryReader
            ((WasmBinaryReader *)local_438,this,(FeatureSet)features,
             (vector<char,_std::allocator<char>_> *)input_00,
             (vector<char,_std::allocator<char>_> *)wasm::defaultEmptySourceMap);
  wasm::WasmBinaryReader::read((WasmBinaryReader *)local_438,(int)pMVar1,__buf,(size_t)input_00);
  wasm::WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)local_438);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->typeIndices)._M_h);
  if (parser._1000_8_ != 0) {
    operator_delete((void *)parser._1000_8_,-parser._1000_8_);
  }
  return this;
}

Assistant:

BinaryenModuleRef BinaryenModuleReadWithFeatures(char* input,
                                                 size_t inputSize,
                                                 BinaryenFeatures features) {
  auto* wasm = new Module;
  std::vector<char> buffer(false);
  buffer.resize(inputSize);
  std::copy_n(input, inputSize, buffer.begin());
  try {
    WasmBinaryReader parser(*wasm, features, buffer);
    parser.read();
  } catch (ParseException& p) {
    p.dump(std::cerr);
    Fatal() << "error in parsing wasm binary";
  }
  // Do not regress code size by maintaining type order. TODO: Add an option to
  // control this.
  wasm->typeIndices.clear();
  return wasm;
}